

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  pointer pcVar1;
  string_view str;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 msg;
  bool bVar2;
  EnumValueDescriptor *pEVar3;
  char *bytes;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *pSVar4;
  string_view str_00;
  Metadata MVar5;
  StatusOr<long> x;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> x_5;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_60;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_58;
  undefined1 local_50 [32];
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_30;
  
  switch(field->type_) {
  case '\x01':
    x.super_StatusOrData<long>.field_1 =
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)(field->field_22).default_value_int64_t_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((writer->options_).allow_legacy_syntax == true) {
        absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                  ((StatusOrData<double> *)&x);
        if (0x7fefffffffffffff < (x.super_StatusOrData<long>.field_1.data_ & 0x7fffffffffffffffU)) {
          absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                    ((StatusOrData<double> *)&x);
          x.super_StatusOrData<long>.field_1.data_ = 0;
        }
      }
      absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                ((StatusOrData<double> *)&x);
      JsonWriter::Write(writer,(double)x.super_StatusOrData<long>.field_1);
LAB_0029c062:
      pSVar4 = (StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x;
LAB_0029c067:
      absl::lts_20240722::Status::~Status((Status *)pSVar4);
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    break;
  case '\x02':
    x.super_StatusOrData<long>.field_1.data_._0_4_ = (field->field_22).default_value_int32_t_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((writer->options_).allow_legacy_syntax == true) {
        absl::lts_20240722::internal_statusor::StatusOrData<float>::EnsureOk
                  ((StatusOrData<float> *)&x);
        if (0x7f7fffff < (x.super_StatusOrData<long>.field_1.data_._0_4_ & 0x7fffffff)) {
          absl::lts_20240722::internal_statusor::StatusOrData<float>::EnsureOk
                    ((StatusOrData<float> *)&x);
          x.super_StatusOrData<long>.field_1.data_._0_4_ = 0;
        }
      }
      absl::lts_20240722::internal_statusor::StatusOrData<float>::EnsureOk
                ((StatusOrData<float> *)&x);
      JsonWriter::Write(writer,(float)x.super_StatusOrData<long>.field_1.data_._0_4_);
      goto LAB_0029c062;
    }
    break;
  case '\x03':
  case '\x10':
  case '\x12':
    x.super_StatusOrData<long>.field_1 =
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)(field->field_22).default_value_int64_t_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((writer->options_).unquote_int64_if_possible == true) {
        absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                  (&x.super_StatusOrData<long>);
        bVar2 = RoundTripsThroughDouble<long>(x.super_StatusOrData<long>.field_1.data_);
        if (bVar2) {
          absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                    (&x.super_StatusOrData<long>);
          JsonWriter::Write(writer,x.super_StatusOrData<long>.field_1.data_);
          goto LAB_0029c062;
        }
      }
      absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                (&x.super_StatusOrData<long>);
      local_58 = x.super_StatusOrData<long>.field_1;
      JsonWriter::Write<long>(writer,(Quoted<long> *)&local_58);
      goto LAB_0029c062;
    }
    break;
  case '\x04':
  case '\x06':
    x.super_StatusOrData<long>.field_1 =
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)(field->field_22).default_value_int64_t_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((writer->options_).unquote_int64_if_possible == true) {
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                  ((StatusOrData<unsigned_long> *)&x);
        bVar2 = RoundTripsThroughDouble<unsigned_long>(x.super_StatusOrData<long>.field_1.data_);
        if (bVar2) {
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                    ((StatusOrData<unsigned_long> *)&x);
          JsonWriter::Write(writer,x.super_StatusOrData<long>.field_1.data_);
          goto LAB_0029c062;
        }
      }
      absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                ((StatusOrData<unsigned_long> *)&x);
      local_60 = x.super_StatusOrData<long>.field_1;
      JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_60);
      goto LAB_0029c062;
    }
    break;
  case '\x05':
  case '\x0f':
  case '\x11':
    x.super_StatusOrData<long>.field_1.data_._0_4_ = (field->field_22).default_value_int32_t_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk((StatusOrData<int> *)&x);
      JsonWriter::Write(writer,x.super_StatusOrData<long>.field_1.data_._0_4_);
      goto LAB_0029c062;
    }
    break;
  case '\a':
  case '\r':
    x.super_StatusOrData<long>.field_1.data_._0_4_ = (field->field_22).default_value_int32_t_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::EnsureOk
                ((StatusOrData<unsigned_int> *)&x);
      JsonWriter::Write(writer,x.super_StatusOrData<long>.field_1.data_._0_4_);
      goto LAB_0029c062;
    }
    break;
  case '\b':
    x.super_StatusOrData<long>.field_1.data_._0_1_ = (field->field_22).default_value_bool_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk((StatusOrData<bool> *)&x);
      bytes = "false";
      if ((ulong)(byte)x.super_StatusOrData<long>.field_1.data_._0_1_ != 0) {
        bytes = "true";
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                (&writer->sink_,bytes,
                 (ulong)(byte)x.super_StatusOrData<long>.field_1.data_._0_1_ ^ 5);
      goto LAB_0029c062;
    }
    break;
  case '\t':
    pcVar1 = (((field->field_22).default_value_string_)->_M_dataplus)._M_p;
    x.super_StatusOrData<long>.field_1 =
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
         (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
         ((field->field_22).default_value_string_)->_M_string_length;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x);
      local_30.value.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len = (size_t)x.super_StatusOrData<long>.field_1;
      local_30.value.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str = pcVar1;
      JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_30);
      goto LAB_0029c062;
    }
    break;
  case '\n':
  case '\v':
    UnparseProto2Descriptor::GetMessage((Field)&x);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
      EnsureOk((StatusOrData<const_google::protobuf::Message_*> *)&x);
      msg.data_ = x.super_StatusOrData<long>.field_1.data_;
      absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
      EnsureOk((StatusOrData<const_google::protobuf::Message_*> *)&x);
      MVar5 = Message::GetMetadata((Message *)x.super_StatusOrData<long>.field_1);
      WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                (this,writer,(Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)msg,
                 MVar5.descriptor,false);
    }
    break;
  case '\f':
    x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1.data_.
    _M_str = (((field->field_22).default_value_string_)->_M_dataplus)._M_p;
    x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1.data_.
    _M_len = ((field->field_22).default_value_string_)->_M_string_length;
    x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0 =
         (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
          )0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x_5);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((writer->options_).allow_legacy_syntax == true) {
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                  (&x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
        absl::lts_20240722::CEscape_abi_cxx11_
                  (&x,x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                      .field_1.data_._M_len,
                   x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                   field_1.data_._M_str);
        str_00._M_str = (char *)x.super_StatusOrData<long>.field_0;
        str_00._M_len = x.super_StatusOrData<long>.field_1.data_;
        JsonWriter::WriteBase64(writer,str_00);
        std::__cxx11::string::~string((string *)&x);
      }
      else {
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                  (&x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
        str._M_str = x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                     field_1.data_._M_str;
        str._M_len = x_5.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                     field_1.data_._M_len;
        JsonWriter::WriteBase64(writer,str);
      }
      pSVar4 = &x_5;
      goto LAB_0029c067;
    }
    pSVar4 = &x_5;
    goto LAB_0029bfdf;
  case '\x0e':
    pEVar3 = FieldDescriptor::default_value_enum(field);
    x.super_StatusOrData<long>.field_1.data_._0_4_ = pEVar3->number_;
    x.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk((StatusOrData<int> *)&x);
      WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
                (writer,field,x.super_StatusOrData<long>.field_1.data_._0_4_,kUnquoted);
      goto LAB_0029c062;
    }
    break;
  default:
    x.super_StatusOrData<long> =
         (StatusOrData<long>)absl::lts_20240722::NullSafeStringView("unsupported field type: ");
    absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)&x_5,(uint)field->type_);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_50,(AlphaNum *)&x);
    absl::lts_20240722::InvalidArgumentError(this,local_50._8_8_,local_50._0_8_);
    std::__cxx11::string::~string((string *)local_50);
    return (Status)(uintptr_t)this;
  }
  pSVar4 = (StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x;
LAB_0029bfdf:
  absl::lts_20240722::Status::~Status((Status *)pSVar4);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteSingular(JsonWriter& writer, Field<Traits> field,
                           Args&&... args) {
  // When the pack `args` is empty, the caller has requested printing the
  // default value.
  bool is_default = sizeof...(Args) == 0;
  switch (Traits::FieldType(field)) {
    case FieldDescriptor::TYPE_FLOAT: {
      auto x = Traits::GetFloat(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_DOUBLE: {
      auto x = Traits::GetDouble(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_INT64: {
      auto x = Traits::GetInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64: {
      auto x = Traits::GetUInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_INT32: {
      auto x = Traits::GetInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32: {
      auto x = Traits::GetUInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_BOOL: {
      auto x = Traits::GetBool(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x ? "true" : "false");
      break;
    }
    case FieldDescriptor::TYPE_STRING: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(MakeQuoted(*x));
      break;
    }
    case FieldDescriptor::TYPE_BYTES: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default) {
        // Although difficult to verify, it appears that the original ESF parser
        // fails to unescape the contents of a
        // google.protobuf.Field.default_value, which may potentially be
        // escaped if it is for a `bytes` field (note that default_value is a
        // `string` regardless of what type the field is).
        //
        // However, our parser's type.proto guts actually know to do this
        // correctly, so this bug must be manually re-introduced.
        writer.WriteBase64(absl::CEscape(*x));
      } else {
        writer.WriteBase64(*x);
      }
      break;
    }
    case FieldDescriptor::TYPE_ENUM: {
      auto x = Traits::GetEnumValue(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      WriteEnum<Traits>(writer, field, *x);
      break;
    }
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP: {
      auto x = Traits::GetMessage(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      return WriteMessage<Traits>(writer, **x, Traits::GetDesc(**x));
    }
    default:
      return absl::InvalidArgumentError(
          absl::StrCat("unsupported field type: ", Traits::FieldType(field)));
  }

  return absl::OkStatus();
}